

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::HttpClient::openWebSocket(HttpClient *this,StringPtr url,HttpHeaders *headers)

{
  long lVar1;
  void *pvVar2;
  TransformPromiseNodeBase *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  Request local_58;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_40;
  undefined1 local_38;
  
  local_38 = 0;
  (*(code *)**(undefined8 **)url.content.ptr)(&local_58,url.content.ptr,0,url.content.size_,headers)
  ;
  lVar1 = *(long *)((long)local_58.response.super_PromiseBase.node.ptr + 8);
  if (lVar1 == 0 || (ulong)((long)local_58.response.super_PromiseBase.node.ptr - lVar1) < 0x28) {
    pvVar2 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar2 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_58.response,
               kj::_::
               SimpleTransformPromiseNode<kj::HttpClient::Response,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5744:22)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar2 + 0x3d8) = &PTR_destroy_00592178;
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    *(undefined8 *)((long)local_58.response.super_PromiseBase.node.ptr + 8) = 0;
    this_00 = (TransformPromiseNodeBase *)
              ((long)local_58.response.super_PromiseBase.node.ptr + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_58.response,
               kj::_::
               SimpleTransformPromiseNode<kj::HttpClient::Response,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5744:22)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)local_58.response.super_PromiseBase.node.ptr + -0x28) =
         &PTR_destroy_00592178;
    *(long *)((long)local_58.response.super_PromiseBase.node.ptr + -0x20) = lVar1;
  }
  local_60.ptr = (PromiseNode *)0x0;
  this->_vptr_HttpClient = (_func_int **)this_00;
  local_40.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
  Request::~Request(&local_58);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<HttpClient::WebSocketResponse> HttpClient::openWebSocket(
    kj::StringPtr url, const HttpHeaders& headers) {
  return request(HttpMethod::GET, url, headers, kj::none)
      .response.then([](HttpClient::Response&& response) -> WebSocketResponse {
    kj::OneOf<kj::Own<kj::AsyncInputStream>, kj::Own<WebSocket>> body;
    body.init<kj::Own<kj::AsyncInputStream>>(kj::mv(response.body));

    return {
      response.statusCode,
      response.statusText,
      response.headers,
      kj::mv(body)
    };
  });
}